

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTimings(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,TYPE ttype)

{
  Statistics *pSVar1;
  Timer *pTVar2;
  
  pTVar2 = TimerFactory::switchTimer((this->_slufactor).solveTime,ttype);
  (this->_slufactor).solveTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer
                     ((this->_slufactor).
                      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .factorTime,ttype);
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .factorTime = pTVar2;
  (this->_slufactor).timerType = ttype;
  pTVar2 = TimerFactory::switchTimer(this->_statistics->readingTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->readingTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->simplexTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->simplexTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->syncTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->syncTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->solvingTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->solvingTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->preprocessingTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->preprocessingTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->rationalTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->rationalTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->transformTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->transformTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->reconstructionTime,ttype);
  pSVar1 = this->_statistics;
  pSVar1->reconstructionTime = pTVar2;
  pTVar2 = TimerFactory::switchTimer(pSVar1->boostingStepTime,ttype);
  this->_statistics->boostingStepTime = pTVar2;
  return;
}

Assistant:

void SoPlexBase<R>::setTimings(const Timer::TYPE ttype)
{
   _slufactor.changeTimer(ttype);
   _statistics->readingTime = TimerFactory::switchTimer(_statistics->readingTime, ttype);
   _statistics->simplexTime = TimerFactory::switchTimer(_statistics->simplexTime, ttype);
   _statistics->syncTime = TimerFactory::switchTimer(_statistics->syncTime, ttype);
   _statistics->solvingTime = TimerFactory::switchTimer(_statistics->solvingTime, ttype);
   _statistics->preprocessingTime = TimerFactory::switchTimer(_statistics->preprocessingTime, ttype);
   _statistics->rationalTime = TimerFactory::switchTimer(_statistics->rationalTime, ttype);
   _statistics->transformTime = TimerFactory::switchTimer(_statistics->transformTime, ttype);
   _statistics->reconstructionTime = TimerFactory::switchTimer(_statistics->reconstructionTime, ttype);
   _statistics->boostingStepTime = TimerFactory::switchTimer(_statistics->boostingStepTime, ttype);
}